

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O0

void vera::texture(Texture *_texture,string *_uniform_name)

{
  Shader *pSVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  allocator local_a9;
  string local_a8 [48];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string uniform_name;
  string *_uniform_name_local;
  Texture *_texture_local;
  
  uniform_name.field_2._8_8_ = _uniform_name;
  if (shaderPtr == (Shader *)0x0) {
    shaderPtr = getFillShader();
  }
  std::__cxx11::string::string((string *)local_38,(string *)_uniform_name);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 == 0) {
    toString<unsigned_long>(&local_78,&shaderPtr->textureIndex);
    std::operator+(&local_58,"u_tex",&local_78);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  pSVar1 = shaderPtr;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"USE_TEXTURE",&local_a9);
  (*(pSVar1->super_HaveDefines)._vptr_HaveDefines[10])(pSVar1,local_a8,local_38);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  Shader::setUniformTexture(shaderPtr,(string *)local_38,_texture,shaderPtr->textureIndex);
  pSVar1 = shaderPtr;
  std::operator+(&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "Resolution");
  iVar2 = (*_texture->_vptr_Texture[0xc])();
  iVar3 = (*_texture->_vptr_Texture[0xd])();
  Shader::setUniform(pSVar1,&local_d0,(float)iVar2,(float)iVar3);
  std::__cxx11::string::~string((string *)&local_d0);
  shaderPtr->textureIndex = shaderPtr->textureIndex + 1;
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void texture(Texture* _texture, const std::string _uniform_name) {
    if (shaderPtr == nullptr)
        shaderPtr = getFillShader();
    
    std::string uniform_name = _uniform_name;
    if (_uniform_name.size() == 0)
        uniform_name = "u_tex" + toString(shaderPtr->textureIndex);
    shaderPtr->addDefine("USE_TEXTURE", uniform_name);
    shaderPtr->setUniformTexture(uniform_name, _texture, shaderPtr->textureIndex );
    shaderPtr->setUniform(uniform_name + "Resolution", (float)_texture->getWidth(), (float)_texture->getHeight());
    shaderPtr->textureIndex++;
}